

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::BasicOcclusionQueryTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BasicOcclusionQueryTestInstance *this)

{
  Context *this_00;
  BasicOcclusionQueryTestInstance *pBVar1;
  deUint32 _queueFamilyIndex;
  VkResult VVar2;
  VkDevice device;
  VkQueue pVVar3;
  DeviceInterface *vk;
  MessageBuilder *this_01;
  TestError *this_02;
  size_t __n;
  void *__buf;
  unsigned_long *value;
  TestStatus *pTVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  allocator<char> local_362;
  allocator<char> local_361;
  VkCommandBuffer_s *local_360;
  RefBase<vk::VkCommandBuffer_s_*> local_358;
  TestStatus *local_338;
  BasicOcclusionQueryTestInstance *local_330;
  deUint64 queryResults [2];
  string local_310;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> renderPassClearValues;
  string local_2d8;
  VkDeviceSize vertexBufferOffset;
  VkBuffer vertexBuffer;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  CmdBufferBeginInfo beginInfo;
  undefined1 local_268 [8];
  DeviceInterface *pDStack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [23];
  RenderPassBeginInfo renderPassBegin;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  VkSubmitInfo submitInfo;
  
  this_00 = (this->super_TestInstance).m_context;
  local_360 = (VkCommandBuffer_s *)this_00->m_testCtx->m_log;
  device = Context::getDevice(this_00);
  pVVar3 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  local_330 = this;
  _queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo
            ((CmdPoolCreateInfo *)&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,_queueFamilyIndex
             ,2);
  ::vk::createCommandPool
            (&cmdPool,vk,device,&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,
             (VkAllocationCallbacks *)0x0);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_268,vk,device,
             (VkCommandPool)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_358.m_data.deleter.m_device = (VkDevice)local_258[0]._0_8_;
  local_358.m_data.deleter.m_pool.m_internal = local_258[0]._8_8_;
  local_358.m_data.object = (VkCommandBuffer_s *)local_268;
  local_358.m_data.deleter.m_deviceIface = pDStack_260;
  local_268 = (undefined1  [8])0x0;
  pDStack_260 = (DeviceInterface *)0x0;
  local_258[0]._M_allocated_capacity = (VkDevice)0x0;
  local_258[0]._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_268);
  Draw::CmdBufferBeginInfo::CmdBufferBeginInfo(&beginInfo,0);
  pBVar1 = local_330;
  (*vk->_vptr_DeviceInterface[0x49])(vk,local_358.m_data.object,&beginInfo);
  Draw::transition2DImage
            (vk,local_358.m_data.object,
             (VkImage)(((pBVar1->m_stateObjects->m_colorAttachmentImage).m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1,
             VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,0,0x100);
  Draw::transition2DImage
            (vk,local_358.m_data.object,
             (VkImage)(((pBVar1->m_stateObjects->m_DepthImage).m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,2,
             VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,0,0x400);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
            (&renderPassClearValues,2,(allocator_type *)local_268);
  memset(renderPassClearValues.
         super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
         super__Vector_impl_data._M_start,0,
         ((long)renderPassClearValues.
                super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)renderPassClearValues.
               super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
               super__Vector_impl_data._M_start) * 0x10000000 >> 0x1c);
  Draw::RenderPassBeginInfo::RenderPassBeginInfo
            (&renderPassBegin,
             (VkRenderPass)
             (pBVar1->m_stateObjects->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.
             m_data.object.m_internal,
             (VkFramebuffer)
             (pBVar1->m_stateObjects->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.
             m_data.object.m_internal,(VkRect2D)(ZEXT816(0x8000000080) << 0x40),
             &renderPassClearValues);
  (*vk->_vptr_DeviceInterface[0x70])
            (vk,local_358.m_data.object,(pBVar1->m_queryPool).m_internal,0,2);
  (*vk->_vptr_DeviceInterface[0x74])(vk,local_358.m_data.object,&renderPassBegin,0);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_358.m_data.object,0,
             (pBVar1->m_stateObjects->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.
             m_data.object.m_internal);
  vertexBuffer.m_internal =
       (((pBVar1->m_stateObjects->m_vertexBuffer).m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  vertexBufferOffset = 0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_358.m_data.object,0,1);
  (*vk->_vptr_DeviceInterface[0x6e])
            (vk,local_358.m_data.object,(pBVar1->m_queryPool).m_internal,0,
             (ulong)(pBVar1->m_testVector).queryControlFlags);
  (*vk->_vptr_DeviceInterface[0x6f])(vk,local_358.m_data.object,(pBVar1->m_queryPool).m_internal,0);
  (*vk->_vptr_DeviceInterface[0x6e])
            (vk,local_358.m_data.object,(pBVar1->m_queryPool).m_internal,1,
             (ulong)(pBVar1->m_testVector).queryControlFlags);
  (*vk->_vptr_DeviceInterface[0x59])(vk,local_358.m_data.object,3,1,0,0);
  (*vk->_vptr_DeviceInterface[0x6f])(vk,local_358.m_data.object,(pBVar1->m_queryPool).m_internal,1);
  (*vk->_vptr_DeviceInterface[0x76])(vk,local_358.m_data.object);
  Draw::transition2DImage
            (vk,local_358.m_data.object,
             (VkImage)(((pBVar1->m_stateObjects->m_colorAttachmentImage).m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1,
             VK_IMAGE_LAYOUT_GENERAL,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,0x100,0x800);
  (*vk->_vptr_DeviceInterface[0x4a])(vk,local_358.m_data.object);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&local_358;
  (*vk->_vptr_DeviceInterface[2])(vk,pVVar3,1,&submitInfo,0);
  VVar2 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar3);
  ::vk::checkResult(VVar2,"vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                    ,0x1ab);
  value = queryResults;
  queryResults[0] = 0;
  queryResults[1] = 0;
  VVar2 = (*vk->_vptr_DeviceInterface[0x20])
                    (vk,device,(pBVar1->m_queryPool).m_internal,0,2,0x10,value,8,1);
  if (VVar2 == VK_NOT_READY) {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Query result not avaliable, but vkWaitIdle() was called.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
               ,0x1b4);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  __n = 0x1b7;
  ::vk::checkResult(VVar2,"queryResult",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                    ,0x1b7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"OcclusionQueryResults",&local_361);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"Occlusion query results",&local_362);
  tcu::LogSection::LogSection((LogSection *)local_268,&local_310,&local_2d8);
  local_338 = __return_storage_ptr__;
  tcu::LogSection::write((LogSection *)local_268,(int)local_360,__buf,__n);
  tcu::LogSection::~LogSection((LogSection *)local_268);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_310);
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    local_268 = (undefined1  [8])local_360;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_260);
    std::operator<<((ostream *)&pDStack_260,"query[ slot == ");
    std::ostream::operator<<((ostringstream *)&pDStack_260,(int)lVar6);
    std::operator<<((ostream *)&pDStack_260,"] result == ");
    this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_268,value);
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_260);
    value = value + 1;
  }
  bVar7 = true;
  lVar6 = 0;
  do {
    if (lVar6 == 2) {
      tcu::TestLog::endSection((TestLog *)local_360);
      if (bVar7) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_268,"Query result verification passed",
                   (allocator<char> *)&local_310);
        pTVar4 = local_338;
        local_338->m_code = QP_TEST_RESULT_PASS;
        std::__cxx11::string::string((string *)&local_338->m_description,(string *)local_268);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_268,"Query result verification failed",
                   (allocator<char> *)&local_310);
        pTVar4 = local_338;
        local_338->m_code = QP_TEST_RESULT_FAIL;
        std::__cxx11::string::string((string *)&local_338->m_description,(string *)local_268);
      }
      std::__cxx11::string::~string((string *)local_268);
      std::_Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~_Vector_base
                (&renderPassBegin.m_clearValues.
                  super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>);
      std::_Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~_Vector_base
                (&renderPassClearValues.
                  super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>);
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_358);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>);
      return pTVar4;
    }
    uVar5 = (uint)lVar6;
    if ((((local_330->m_testVector).queryControlFlags & 1) == 0 & (byte)lVar6) == 0) {
      if (queryResults[lVar6] != (ulong)(uVar5 & 1) * 3) {
        local_268 = (undefined1  [8])local_360;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_260);
        std::operator<<((ostream *)&pDStack_260,
                        "vkGetQueryPoolResults returned wrong value of query for index ");
        std::ostream::operator<<((ostringstream *)&pDStack_260,uVar5);
        std::operator<<((ostream *)&pDStack_260,", expected ");
        std::ostream::_M_insert<unsigned_long>((ulong)&pDStack_260);
        std::operator<<((ostream *)&pDStack_260,", got ");
        std::ostream::_M_insert<unsigned_long>((ulong)&pDStack_260);
        std::operator<<((ostream *)&pDStack_260,".");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_0066e2d8;
      }
    }
    else if (queryResults[lVar6] == 0) {
      local_268 = (undefined1  [8])local_360;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_260);
      std::operator<<((ostream *)&pDStack_260,
                      "vkGetQueryPoolResults returned wrong value of query for index ");
      std::ostream::operator<<((ostringstream *)&pDStack_260,uVar5);
      std::operator<<((ostream *)&pDStack_260,", expected any non-zero value, got ");
      std::ostream::_M_insert<unsigned_long>((ulong)&pDStack_260);
      std::operator<<((ostream *)&pDStack_260,".");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0066e2d8:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_260);
      bVar7 = false;
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus	BasicOcclusionQueryTestInstance::iterate (void)
{
	tcu::TestLog &log				= m_context.getTestContext().getLog();
	const vk::VkDevice device		= m_context.getDevice();
	const vk::VkQueue queue			= m_context.getUniversalQueue();
	const vk::DeviceInterface& vk	= m_context.getDeviceInterface();

	const CmdPoolCreateInfo			cmdPoolCreateInfo	(m_context.getUniversalQueueFamilyIndex());
	vk::Move<vk::VkCommandPool>		cmdPool				= vk::createCommandPool(vk, device, &cmdPoolCreateInfo);

	vk::Unique<vk::VkCommandBuffer> cmdBuffer			(vk::allocateCommandBuffer(vk, device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const CmdBufferBeginInfo		beginInfo			(0u);

	vk.beginCommandBuffer(*cmdBuffer, &beginInfo);

	transition2DImage(vk, *cmdBuffer, m_stateObjects->m_colorAttachmentImage->object(), vk::VK_IMAGE_ASPECT_COLOR_BIT, vk::VK_IMAGE_LAYOUT_UNDEFINED, vk::VK_IMAGE_LAYOUT_GENERAL, 0, vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
	transition2DImage(vk, *cmdBuffer, m_stateObjects->m_DepthImage->object(), vk::VK_IMAGE_ASPECT_DEPTH_BIT, vk::VK_IMAGE_LAYOUT_UNDEFINED, vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL, 0, vk::VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT);

	std::vector<vk::VkClearValue> renderPassClearValues(2);
	deMemset(&renderPassClearValues[0], 0, static_cast<int>(renderPassClearValues.size()) * sizeof(vk::VkClearValue));

	const vk::VkRect2D renderArea =
	{
		{ 0,					0 },
		{ StateObjects::WIDTH,	StateObjects::HEIGHT }
	};

	RenderPassBeginInfo renderPassBegin(*m_stateObjects->m_renderPass, *m_stateObjects->m_framebuffer, renderArea, renderPassClearValues);

	vk.cmdResetQueryPool(*cmdBuffer, m_queryPool, 0, NUM_QUERIES_IN_POOL);

	vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBegin, vk::VK_SUBPASS_CONTENTS_INLINE);

	vk.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_stateObjects->m_pipeline);

	vk::VkBuffer vertexBuffer = m_stateObjects->m_vertexBuffer->object();
	const vk::VkDeviceSize vertexBufferOffset = 0;
	vk.cmdBindVertexBuffers(*cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

	vk.cmdBeginQuery(*cmdBuffer, m_queryPool, QUERY_INDEX_CAPTURE_EMPTY, m_testVector.queryControlFlags);
	vk.cmdEndQuery(*cmdBuffer, m_queryPool,	QUERY_INDEX_CAPTURE_EMPTY);

	vk.cmdBeginQuery(*cmdBuffer, m_queryPool, QUERY_INDEX_CAPTURE_DRAWCALL, m_testVector.queryControlFlags);
	vk.cmdDraw(*cmdBuffer, NUM_VERTICES_IN_DRAWCALL, 1, 0, 0);
	vk.cmdEndQuery(*cmdBuffer, m_queryPool,	QUERY_INDEX_CAPTURE_DRAWCALL);

	vk.cmdEndRenderPass(*cmdBuffer);

	transition2DImage(vk, *cmdBuffer, m_stateObjects->m_colorAttachmentImage->object(), vk::VK_IMAGE_ASPECT_COLOR_BIT, vk::VK_IMAGE_LAYOUT_GENERAL, vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, vk::VK_ACCESS_TRANSFER_READ_BIT);

	vk.endCommandBuffer(*cmdBuffer);

	// Submit command buffer
	const vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,									// deUint32					waitSemaphoreCount;
		DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,									// deUint32					commandBufferCount;
		&cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,									// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

	VK_CHECK(vk.queueWaitIdle(queue));

	deUint64 queryResults[NUM_QUERIES_IN_POOL] = { 0 };
	size_t queryResultsSize		= sizeof(queryResults);

	vk::VkResult queryResult	= vk.getQueryPoolResults(device, m_queryPool, 0, NUM_QUERIES_IN_POOL, queryResultsSize, queryResults, sizeof(queryResults[0]), vk::VK_QUERY_RESULT_64_BIT);

	if (queryResult == vk::VK_NOT_READY)
	{
		TCU_FAIL("Query result not avaliable, but vkWaitIdle() was called.");
	}

	VK_CHECK(queryResult);

	log << tcu::TestLog::Section("OcclusionQueryResults",
		"Occlusion query results");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(queryResults); ++ndx)
	{
		log << tcu::TestLog::Message << "query[ slot == " << ndx
			<< "] result == " << queryResults[ndx] << tcu::TestLog::EndMessage;
	}

	bool passed = true;

	for (int queryNdx = 0; queryNdx < DE_LENGTH_OF_ARRAY(queryResults); ++queryNdx)
	{

		deUint64 expectedValue;

		switch (queryNdx)
		{
			case QUERY_INDEX_CAPTURE_EMPTY:
				expectedValue = 0;
				break;
			case QUERY_INDEX_CAPTURE_DRAWCALL:
				expectedValue = NUM_VERTICES_IN_DRAWCALL;
				break;
		}

		if ((m_testVector.queryControlFlags & vk::VK_QUERY_CONTROL_PRECISE_BIT) || expectedValue == 0)
		{
			// require precise value
			if (queryResults[queryNdx] != expectedValue)
			{
				log << tcu::TestLog::Message << "vkGetQueryPoolResults returned "
					"wrong value of query for index "
					<< queryNdx << ", expected " << expectedValue << ", got "
					<< queryResults[0] << "." << tcu::TestLog::EndMessage;
				passed = false;
			}
		}
		else
		{
			// require imprecize value > 0
			if (queryResults[queryNdx] == 0)
			{
				log << tcu::TestLog::Message << "vkGetQueryPoolResults returned "
					"wrong value of query for index "
					<< queryNdx << ", expected any non-zero value, got "
					<< queryResults[0] << "." << tcu::TestLog::EndMessage;
				passed = false;
			}
		}
	}
	log << tcu::TestLog::EndSection;

	if (passed)
	{
		return tcu::TestStatus(QP_TEST_RESULT_PASS, "Query result verification passed");
	}
	return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Query result verification failed");
}